

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall LowDiscrepancy_Sobol_Test::TestBody(LowDiscrepancy_Sobol_Test *this)

{
  char *pcVar1;
  int i;
  long lVar2;
  int dim;
  int iVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  double dVar6;
  undefined1 in_XMM1 [16];
  float local_50 [2];
  float local_48 [2];
  AssertionResult gtest_ar;
  
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    for (iVar3 = 0; iVar3 != 100; iVar3 = iVar3 + 1) {
      local_48[0] = pbrt::SobolSampleFloat<pbrt::NoRandomizer>(lVar2,iVar3);
      dVar6 = pbrt::SobolSampleDouble<pbrt::NoRandomizer>(lVar2,iVar3);
      local_50[0] = (float)dVar6;
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)&gtest_ar,"SobolSampleFloat(i, dim, NoRandomizer())",
                 "(float)SobolSampleDouble(i, dim, NoRandomizer())",local_48,local_50);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)local_48);
        pcVar1 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x98,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)local_48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
  }
  for (lVar2 = 0; lVar2 != 0x2000; lVar2 = lVar2 + 1) {
    local_48[0] = pbrt::SobolSampleFloat<pbrt::NoRandomizer>(lVar2,0);
    auVar4._8_8_ = 0x8040201008040201;
    auVar4._0_8_ = 0x8040201008040201;
    auVar4 = vgf2p8affineqb_avx512vl(ZEXT416((uint)lVar2),auVar4,0);
    uVar5 = auVar4._0_4_;
    auVar4 = vcvtusi2ss_avx512f(in_XMM1,uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 |
                                        (uVar5 & 0xff00) << 8 | uVar5 << 0x18);
    local_50[0] = auVar4._0_4_ * 2.3283064e-10;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&gtest_ar,"SobolSampleFloat(i, 0, NoRandomizer())",
               "ReverseBits32(i) * 2.3283064365386963e-10f",local_48,local_50);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)local_48);
      pcVar1 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x9f,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_48);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(LowDiscrepancy, Sobol) {
    // Check that float and double variants match (as float values).
    for (int i = 0; i < 256; ++i) {
        for (int dim = 0; dim < 100; ++dim) {
            EXPECT_EQ(SobolSampleFloat(i, dim, NoRandomizer()),
                      (float)SobolSampleDouble(i, dim, NoRandomizer()));
        }
    }

    // Make sure first dimension is the regular base 2 radical inverse
    for (int i = 0; i < 8192; ++i) {
        EXPECT_EQ(SobolSampleFloat(i, 0, NoRandomizer()),
                  ReverseBits32(i) * 2.3283064365386963e-10f);
    }
}